

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_rename_method(_glist *x,t_symbol *s,int ac,t_atom *av)

{
  _canvasenvironment *p_Var1;
  t_symbol *ptVar2;
  _canvasenvironment *e;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  _glist *x_local;
  
  if ((ac == 0) || (av->a_type != A_SYMBOL)) {
    if ((ac == 0) || (av->a_type != A_DOLLSYM)) {
      ptVar2 = gensym("Pd");
      canvas_rename(x,ptVar2,(t_symbol *)0x0);
    }
    else {
      p_Var1 = canvas_getenv(x);
      canvas_setcurrent(x);
      ptVar2 = binbuf_realizedollsym((av->a_w).w_symbol,p_Var1->ce_argc,p_Var1->ce_argv,1);
      canvas_rename(x,ptVar2,(t_symbol *)0x0);
      canvas_unsetcurrent(x);
    }
  }
  else {
    canvas_rename(x,(av->a_w).w_symbol,(t_symbol *)0x0);
  }
  return;
}

Assistant:

static void canvas_rename_method(t_canvas *x, t_symbol *s, int ac, t_atom *av)
{
    if (ac && av->a_type == A_SYMBOL)
        canvas_rename(x, av->a_w.w_symbol, 0);
    else if (ac && av->a_type == A_DOLLSYM)
    {
        t_canvasenvironment *e = canvas_getenv(x);
        canvas_setcurrent(x);
        canvas_rename(x, binbuf_realizedollsym(av->a_w.w_symbol,
            e->ce_argc, e->ce_argv, 1), 0);
        canvas_unsetcurrent(x);
    }
    else canvas_rename(x, gensym("Pd"), 0);
}